

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall Client::Bind(Client *this,IPAddress *addr,uint16_t port)

{
  uint __hostlong;
  int iVar1;
  pointer piVar2;
  Socket_BindFailed *this_00;
  char *e;
  undefined4 local_34;
  uint16_t local_2e;
  int yes;
  uint32_t uStack_28;
  uint16_t portn;
  sockaddr_in sin;
  uint16_t port_local;
  IPAddress *addr_local;
  Client *this_local;
  
  sin.sin_zero._2_2_ = port;
  unique0x1000013f = addr;
  local_2e = htons(port);
  local_34 = 1;
  piVar2 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                     (&this->impl);
  setsockopt(piVar2->sock,1,2,&local_34,4);
  memset(&yes,0,0x10);
  yes._0_2_ = 2;
  __hostlong = IPAddress::operator_cast_to_unsigned_int(stack0xffffffffffffffe8);
  uStack_28 = htonl(__hostlong);
  yes._2_2_ = local_2e;
  piVar2 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                     (&this->impl);
  iVar1 = bind(piVar2->sock,(sockaddr *)&yes,0x10);
  if (iVar1 == -1) {
    this_00 = (Socket_BindFailed *)__cxa_allocate_exception(0x10);
    e = OSErrorString();
    Socket_BindFailed::Socket_BindFailed(this_00,e);
    __cxa_throw(this_00,&Socket_BindFailed::typeinfo,Socket_BindFailed::~Socket_BindFailed);
  }
  return;
}

Assistant:

void Client::Bind(const IPAddress &addr, uint16_t port)
{
	sockaddr_in sin;
	uint16_t portn = htons(port);

#ifdef WIN32
	BOOL yes = 1;
	setsockopt(this->impl->sock, SOL_SOCKET, SO_REUSEADDR, reinterpret_cast<const char*>(&yes), sizeof(BOOL));
#else
	int yes = 1;
	setsockopt(this->impl->sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof(int));
#endif

	std::memset(&sin, 0, sizeof(sin));
	sin.sin_family = AF_INET;
	sin.sin_addr.s_addr = htonl(addr);
	sin.sin_port = portn;

	if (bind(this->impl->sock, reinterpret_cast<sockaddr *>(&sin), sizeof(sin)) == SOCKET_ERROR)
	{
		throw Socket_BindFailed(OSErrorString());
	}
}